

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assert.cpp
# Opt level: O2

void idx2::AbortHandler(int Signum)

{
  uint uVar1;
  printer Pr;
  printer pStack_28;
  
  uVar1 = Signum - 4;
  if ((uVar1 < 8) && ((0x9dU >> (uVar1 & 0x1f) & 1) != 0)) {
    fprintf(_stderr,"Caught signal %d (%s)\n",Signum,
            &DAT_0018f334 + *(int *)(&DAT_0018f334 + (ulong)uVar1 * 4));
  }
  else {
    fprintf(_stderr,"Caught signal %d\n",Signum);
  }
  printer::printer(&pStack_28,(FILE *)_stderr);
  PrintStacktrace(&pStack_28);
  exit(Signum);
}

Assistant:

void
AbortHandler(int Signum)
{
  cstr Name = nullptr;
  switch (Signum)
  {
    case SIGABRT:
      Name = "SIGABRT";
      break;
    case SIGSEGV:
      Name = "SIGSEGV";
      break;
#if !defined(_WIN32)
    case SIGBUS:
      Name = "SIGBUS";
      break;
#endif
    case SIGILL:
      Name = "SIGILL";
      break;
    case SIGFPE:
      Name = "SIGFPE";
      break;
  };
  if (Name)
    fprintf(stderr, "Caught signal %d (%s)\n", Signum, Name);
  else
    fprintf(stderr, "Caught signal %d\n", Signum);

  printer Pr(stderr);
  PrintStacktrace(&Pr);
  exit(Signum);
}